

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall
ASDCP::MXF::AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor
          (AudioChannelLabelSubDescriptor *this,AudioChannelLabelSubDescriptor *rhs)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UUID *pUVar3;
  MDDEntry *pMVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  MCALabelSubDescriptor::MCALabelSubDescriptor
            (&this->super_MCALabelSubDescriptor,
             (rhs->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict);
  (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__AudioChannelLabelSubDescriptor_00224668;
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &(this->SoundfieldGroupLinkID).m_property;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->SoundfieldGroupLinkID).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00222020;
  (this->SoundfieldGroupLinkID).m_has_value = false;
  this_00 = (this->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_AudioChannelLabelSubDescriptor);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
    super_Identifier<16U>.m_HasValue = true;
    local_28 = (undefined4)uVar1;
    uStack_24 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_20 = (undefined4)uVar2;
    uStack_1c = (undefined4)((ulong)uVar2 >> 0x20);
    *(undefined4 *)
     (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
     super_Identifier<16U>.m_Value = local_28;
    *(undefined4 *)
     ((this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 4) = uStack_24;
    *(undefined4 *)
     ((this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 8) = uStack_20;
    *(undefined4 *)
     ((this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 0xc) = uStack_1c;
    (*(this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket
      [0x14])(this,rhs);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xf5a,
                "ASDCP::MXF::AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(const AudioChannelLabelSubDescriptor &)"
               );
}

Assistant:

AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(const AudioChannelLabelSubDescriptor& rhs) : MCALabelSubDescriptor(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_AudioChannelLabelSubDescriptor);
  Copy(rhs);
}